

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint_impl.hpp
# Opt level: O1

connection_ptr __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::create_connection(endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                    *this)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  _Manager_type *__args_3;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  element_type *peVar6;
  basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this_00;
  connection<websocketpp::config::asio> *pcVar7;
  int iVar8;
  uint uVar9;
  size_t in_RCX;
  char *__n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  endpoint<websocketpp::config::asio::transport_config> *in_RSI;
  connection_ptr cVar11;
  connection_ptr con;
  connection<websocketpp::config::asio> *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  connection<websocketpp::config::asio> *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  __weak_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  local_1b8;
  reference_wrapper<websocketpp::random::none::int_generator<unsigned_int>_> local_1a0 [2];
  int_generator<unsigned_int> local_190 [16];
  _Any_data local_180;
  code *local_170;
  _Any_data local_160;
  code *local_150;
  _Any_data local_140;
  code *local_130;
  _Any_data local_120;
  code *local_110;
  _Any_data local_100;
  code *local_f0;
  _Any_data local_e0;
  code *local_d0;
  _Any_data local_c0;
  code *local_b0;
  _Any_data local_a0;
  code *local_90;
  _Any_data local_80;
  code *local_70;
  _Any_data local_60;
  code *local_50;
  __weak_ptr<void,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  long *local_38;
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (*(basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> **)
              &in_RSI[1].super_socket_type.m_socket_init_handler.super__Function_base._M_functor,
             0x400,"create_connection",in_RCX);
  __args_3 = &in_RSI[1].super_socket_type.m_socket_init_handler.super__Function_base._M_manager;
  local_1a0[0]._M_data =
       (int_generator<unsigned_int> *)
       &in_RSI[2].m_work.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  std::__shared_ptr<websocketpp::connection<websocketpp::config::asio>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<websocketpp::connection<websocketpp::config::asio>>,bool_const&,std::__cxx11::string&,std::shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,websocketpp::log::alevel>>&,std::shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,websocketpp::log::elevel>>&,std::reference_wrapper<websocketpp::random::none::int_generator<unsigned_int>>>
            ((__shared_ptr<websocketpp::connection<websocketpp::config::asio>,(__gnu_cxx::_Lock_policy)2>
              *)&local_1d8,
             (allocator<websocketpp::connection<websocketpp::config::asio>_> *)&local_1b8,
             (bool *)((long)&in_RSI[2].m_work.
                             super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RSI[1].m_tcp_pre_bind_handler,
             (shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>_>
              *)(in_RSI + 1),
             (shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>_>
              *)__args_3,local_1a0);
  pcVar7 = local_1d8;
  local_1b8._M_ptr = local_1d8;
  local_1b8._M_refcount._M_pi = p_Stack_1d0;
  if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_1d0->_M_weak_count = p_Stack_1d0->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_1d0->_M_weak_count = p_Stack_1d0->_M_weak_count + 1;
    }
  }
  std::__weak_ptr<void,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<websocketpp::connection<websocketpp::config::asio>,void>(local_40,&local_1b8);
  connection<websocketpp::config::asio>::set_handle(pcVar7,(connection_hdl *)local_40);
  if (local_38 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)local_38 + 0xc);
      iVar8 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = *(int *)((long)local_38 + 0xc);
      *(int *)((long)local_38 + 0xc) = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (**(code **)(*local_38 + 0x18))();
    }
  }
  pcVar7 = local_1d8;
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)&local_60,&in_RSI[1].m_tcp_pre_init_handler);
  std::function<void_(std::weak_ptr<void>)>::operator=
            (&pcVar7->m_open_handler,(function<void_(std::weak_ptr<void>)> *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)&local_80,&in_RSI[1].m_tcp_post_init_handler);
  std::function<void_(std::weak_ptr<void>)>::operator=
            (&pcVar7->m_close_handler,(function<void_(std::weak_ptr<void>)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)&local_a0,
             (function<void_(std::weak_ptr<void>)> *)&in_RSI[1].m_io_service);
  std::function<void_(std::weak_ptr<void>)>::operator=
            (&pcVar7->m_fail_handler,(function<void_(std::weak_ptr<void>)> *)&local_a0);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_c0,
             (function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&in_RSI[1].m_resolver);
  std::
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator=(&pcVar7->m_ping_handler,
              (function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)&local_c0);
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_e0,
             (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&in_RSI[1].m_listen_backlog);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator=(&pcVar7->m_pong_handler,
              (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)&local_e0);
  if (local_d0 != (code *)0x0) {
    (*local_d0)(&local_e0,&local_e0,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_100,
             (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&in_RSI[1].m_alog.
                 super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator=(&pcVar7->m_pong_timeout_handler,
              (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)&local_100);
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)&local_120,
             (function<void_(std::weak_ptr<void>)> *)
             &in_RSI[2].super_socket_type.m_socket_init_handler.super__Function_base._M_manager);
  std::function<void_(std::weak_ptr<void>)>::operator=
            (&pcVar7->m_interrupt_handler,(function<void_(std::weak_ptr<void>)> *)&local_120);
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)&local_140,
             (function<void_(std::weak_ptr<void>)> *)
             &in_RSI[2].m_tcp_pre_bind_handler.super__Function_base._M_manager);
  std::function<void_(std::weak_ptr<void>)>::operator=
            (&pcVar7->m_http_handler,(function<void_(std::weak_ptr<void>)> *)&local_140);
  if (local_130 != (code *)0x0) {
    (*local_130)(&local_140,&local_140,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::function<bool_(std::weak_ptr<void>)>::function
            ((function<bool_(std::weak_ptr<void>)> *)&local_160,
             (function<bool_(std::weak_ptr<void>)> *)
             &in_RSI[2].m_tcp_pre_init_handler.super__Function_base._M_manager);
  std::function<bool_(std::weak_ptr<void>)>::operator=
            (&pcVar7->m_validate_handler,(function<bool_(std::weak_ptr<void>)> *)&local_160);
  if (local_150 != (code *)0x0) {
    (*local_150)(&local_160,&local_160,__destroy_functor);
  }
  pcVar7 = local_1d8;
  std::
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  ::function((function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
              *)&local_180,
             (function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
              *)&in_RSI[2].m_tcp_post_init_handler.super__Function_base._M_manager);
  std::
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  ::operator=(&pcVar7->m_message_handler,
              (function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
               *)&local_180);
  if (local_170 != (code *)0x0) {
    (*local_170)(&local_180,&local_180,__destroy_functor);
  }
  peVar3 = in_RSI[2].m_acceptor.
           super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar3 != (element_type *)0x1388) {
    local_1d8->m_open_handshake_timeout_dur = (long)peVar3;
  }
  p_Var4 = in_RSI[2].m_acceptor.
           super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1388) {
    local_1d8->m_close_handshake_timeout_dur = (long)p_Var4;
  }
  peVar5 = in_RSI[2].m_resolver.
           super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar5 != (element_type *)0x1388) {
    local_1d8->m_pong_timeout_dur = (long)peVar5;
  }
  p_Var4 = in_RSI[2].m_resolver.
           super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(tot + 0x1c87c60)) {
    local_1d8->m_max_message_size = (size_t)p_Var4;
    peVar6 = (local_1d8->m_processor).
             super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar6 != (element_type *)0x0) {
      peVar6->m_max_message_size = (size_t)p_Var4;
    }
  }
  __n = (char *)in_RSI[2].m_work.
                super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (local_1d8->m_request).super_parser.m_body_bytes_max = (size_t)__n;
  local_1c8 = local_1d8;
  local_1c0 = p_Stack_1d0;
  if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __n = &__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_1d0->_M_use_count = p_Stack_1d0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_1d0->_M_use_count = p_Stack_1d0->_M_use_count + 1;
    }
  }
  uVar9 = transport::asio::endpoint<websocketpp::config::asio::transport_config>::init
                    (in_RSI,(EVP_PKEY_CTX *)&local_1c8);
  _Var10._M_pi = extraout_RDX;
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
    _Var10._M_pi = extraout_RDX_00;
  }
  p_Var4 = p_Stack_1d0;
  if (uVar9 == 0) {
    *(undefined8 *)
     ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
             super__Function_base._M_functor + 8) = 0;
    p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(connection<websocketpp::config::asio> **)
     &(this->super_transport_type).super_socket_type.m_socket_init_handler.super__Function_base.
      _M_functor = local_1d8;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
             super__Function_base._M_functor + 8) = p_Var4;
    local_1d8 = (connection<websocketpp::config::asio> *)0x0;
  }
  else {
    this_00 = (basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *)*__args_3;
    (*extraout_RDX->_vptr__Sp_counted_base[4])(local_1a0,extraout_RDX,(ulong)uVar9);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_00,0x20,local_1a0,(size_t)__n);
    _Var10._M_pi = extraout_RDX_01;
    if (local_1a0[0]._M_data != local_190) {
      operator_delete(local_1a0[0]._M_data);
      _Var10._M_pi = extraout_RDX_02;
    }
    *(undefined8 *)
     &(this->super_transport_type).super_socket_type.m_socket_init_handler.super__Function_base.
      _M_functor = 0;
    *(undefined8 *)
     ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
             super__Function_base._M_functor + 8) = 0;
  }
  if (local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &(local_1b8._M_refcount._M_pi)->_M_weak_count;
      iVar8 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar8 = (local_1b8._M_refcount._M_pi)->_M_weak_count;
      (local_1b8._M_refcount._M_pi)->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*(local_1b8._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      _Var10._M_pi = extraout_RDX_03;
    }
  }
  if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
    _Var10._M_pi = extraout_RDX_04;
  }
  cVar11.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var10._M_pi;
  cVar11.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (connection_ptr)
         cVar11.
         super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename endpoint<connection,config>::connection_ptr
endpoint<connection,config>::create_connection() {
    m_alog->write(log::alevel::devel,"create_connection");
    //scoped_lock_type lock(m_state_lock);

    /*if (m_state == STOPPING || m_state == STOPPED) {
        return connection_ptr();
    }*/

    //scoped_lock_type guard(m_mutex);
    // Create a connection on the heap and manage it using a shared pointer
    connection_ptr con = lib::make_shared<connection_type>(m_is_server,
        m_user_agent, m_alog, m_elog, lib::ref(m_rng));

    connection_weak_ptr w(con);

    // Create a weak pointer on the heap using that shared_ptr.
    // Cast that weak pointer to void* and manage it using another shared_ptr
    // connection_hdl hdl(reinterpret_cast<void*>(new connection_weak_ptr(con)));

    con->set_handle(w);

    // Copy default handlers from the endpoint
    con->set_open_handler(m_open_handler);
    con->set_close_handler(m_close_handler);
    con->set_fail_handler(m_fail_handler);
    con->set_ping_handler(m_ping_handler);
    con->set_pong_handler(m_pong_handler);
    con->set_pong_timeout_handler(m_pong_timeout_handler);
    con->set_interrupt_handler(m_interrupt_handler);
    con->set_http_handler(m_http_handler);
    con->set_validate_handler(m_validate_handler);
    con->set_message_handler(m_message_handler);

    if (m_open_handshake_timeout_dur != config::timeout_open_handshake) {
        con->set_open_handshake_timeout(m_open_handshake_timeout_dur);
    }
    if (m_close_handshake_timeout_dur != config::timeout_close_handshake) {
        con->set_close_handshake_timeout(m_close_handshake_timeout_dur);
    }
    if (m_pong_timeout_dur != config::timeout_pong) {
        con->set_pong_timeout(m_pong_timeout_dur);
    }
    if (m_max_message_size != config::max_message_size) {
        con->set_max_message_size(m_max_message_size);
    }
    con->set_max_http_body_size(m_max_http_body_size);

    lib::error_code ec;

    ec = transport_type::init(con);
    if (ec) {
        m_elog->write(log::elevel::fatal,ec.message());
        return connection_ptr();
    }

    return con;
}